

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cc
# Opt level: O3

void __thiscall iqxmlrpc::Server_feedback::set_exit_flag(Server_feedback *this)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->server_ != (Server *)0x0) {
    Server::set_exit_flag(this->server_);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Server_feedback: null pointer access.","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00188160;
  *(undefined4 *)(this_00 + 0x10) = 0xffff8300;
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server_feedback::set_exit_flag()
{
  if (!server_) // should never be
    throw Exception("Server_feedback: null pointer access.");

  server_->set_exit_flag();
}